

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

void breakmsg(obj *obj,boolean in_view)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  cVar1 = obj->oclass;
  iVar3 = 0x14f;
  if (cVar1 != '\b') {
    iVar3 = (int)obj->otyp;
  }
  if (iVar3 < 0x10f) {
    if ((3 < iVar3 - 0xeaU) && (iVar3 != 0x6b)) goto LAB_00182be5;
  }
  else {
    if (iVar3 < 0x14f) {
      if ((iVar3 == 0x10f) || (iVar3 == 0x119)) {
        pcVar5 = "Splat!";
LAB_00182bbf:
        pline(pcVar5);
        return;
      }
      if (iVar3 == 0x120) {
        if (in_view == '\0') {
          return;
        }
        pcVar5 = "What a mess!";
        goto LAB_00182bbf;
      }
    }
    else {
      if (iVar3 - 0x218U < 2) {
        pcVar5 = "Splash!";
        goto LAB_00182bbf;
      }
      if (iVar3 == 0x14f) {
        pcVar5 = "";
        goto LAB_00182b57;
      }
    }
LAB_00182be5:
    if ((cVar1 != '\x04') && (cVar1 != '\v')) {
      warning("breaking odd object?");
    }
  }
  pcVar5 = " into a thousand pieces";
LAB_00182b57:
  if (in_view == '\0') {
    You_hear("something shatter!");
    return;
  }
  pcVar2 = Doname2(obj);
  pcVar4 = "";
  if (obj->quan == 1) {
    pcVar4 = "s";
  }
  pline("%s shatter%s%s!",pcVar2,pcVar4,pcVar5);
  return;
}

Assistant:

static void breakmsg(struct obj *obj, boolean in_view)
{
	const char *to_pieces;

	to_pieces = "";
	switch (obj->oclass == POTION_CLASS ? POT_WATER : obj->otyp) {
		default: /* glass or crystal wand or ring */
		    if (obj->oclass != WAND_CLASS && obj->oclass != RING_CLASS)
			warning("breaking odd object?");
		case CRYSTAL_PLATE_MAIL:
		case LENSES:
		case MIRROR:
		case CRYSTAL_BALL:
		case EXPENSIVE_CAMERA:
			to_pieces = " into a thousand pieces";
			/*FALLTHRU*/
		case POT_WATER:		/* really, all potions */
			if (!in_view)
			    You_hear("something shatter!");
			else
			    pline("%s shatter%s%s!", Doname2(obj),
				(obj->quan==1) ? "s" : "", to_pieces);
			break;
		case EGG:
		case MELON:
			pline("Splat!");
			break;
		case CREAM_PIE:
			if (in_view) pline("What a mess!");
			break;
		case ACID_VENOM:
		case BLINDING_VENOM:
			pline("Splash!");
			break;
	}
}